

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O3

bool __thiscall HACD::Graph::DeleteVertex(Graph *this,long name)

{
  pointer pGVar1;
  long *plVar2;
  pointer plVar3;
  void *pvVar4;
  unsigned_long_long *puVar5;
  pointer pGVar6;
  long lVar7;
  
  pGVar1 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = ((long)(this->m_vertices).
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pGVar1 >> 4) * 0x7d6343eb1a1f58d1;
  if (lVar7 - name != 0 && name <= lVar7) {
    pGVar1[name].m_deleted = true;
    pGVar1[name].m_edges.m_size = 0;
    plVar2 = pGVar1[name].m_edges.m_data;
    pGVar6 = pGVar1;
    if (plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
      pGVar6 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pGVar1[name].m_edges.m_data = (long *)0x0;
    pGVar1[name].m_edges.m_maxSize = 0x10;
    plVar3 = pGVar6[name].m_ancestors.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar4 = *(void **)&pGVar6[name].m_ancestors.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl;
    *(undefined8 *)&pGVar6[name].m_ancestors.super__Vector_base<long,_std::allocator<long>_>._M_impl
         = 0;
    pGVar6[name].m_ancestors.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pGVar6[name].m_ancestors.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)plVar3 - (long)pvVar4);
      pGVar6 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    if (pGVar6[name].m_convexHull != (ICHUll *)0x0) {
      (*(pGVar6[name].m_convexHull)->_vptr_ICHUll[1])();
      pGVar6 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SArray<HACD::DPoint,_16UL>::Clear(&pGVar6[name].m_distPoints);
    pGVar1 = (this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pGVar1[name].m_boudaryEdges.m_size = 0;
    puVar5 = pGVar1[name].m_boudaryEdges.m_data;
    pGVar6 = pGVar1;
    if (puVar5 != (unsigned_long_long *)0x0) {
      operator_delete__(puVar5);
      pGVar6 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pGVar1[name].m_boudaryEdges.m_data = (unsigned_long_long *)0x0;
    pGVar1[name].m_boudaryEdges.m_maxSize = 0x10;
    pGVar6[name].m_convexHull = (ICHUll *)0x0;
    this->m_nV = this->m_nV - 1;
  }
  return lVar7 - name != 0 && name <= lVar7;
}

Assistant:

bool Graph::DeleteVertex(long name)
    {
		if (name < static_cast<long>(m_vertices.size()))
		{
			m_vertices[name].m_deleted = true;
            m_vertices[name].m_edges.Clear();
            m_vertices[name].m_ancestors = std::vector<long>();
            delete m_vertices[name].m_convexHull;
			m_vertices[name].m_distPoints.Clear();
			m_vertices[name].m_boudaryEdges.Clear();
            m_vertices[name].m_convexHull = 0;
			m_nV--;
			return true;
		}
		return false;
    }